

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int file_write(FILE *stream,void *buffer,size_t size)

{
  char *pcVar1;
  FILE *__stream;
  size_t sVar2;
  int *piVar3;
  char *pcVar4;
  size_t size_local;
  void *buffer_local;
  FILE *stream_local;
  
  sVar2 = fwrite_unlocked(buffer,size,1,(FILE *)stream);
  __stream = _stderr;
  pcVar1 = argv0;
  if ((sVar2 == 1) || (size == 0)) {
    fflush((FILE *)stream);
    stream_local._4_4_ = 1;
  }
  else {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(__stream,"%s: failed writing %lu bytes: %s\n",pcVar1,size,pcVar4);
    stream_local._4_4_ = 0;
  }
  return stream_local._4_4_;
}

Assistant:

int
file_write(
    FILE* stream,
    const void* buffer,
    size_t size)
{
    if (fwrite_unlocked(buffer, size, 1, stream) != 1 && size != 0) {
        fprintf(stderr, "%s: failed writing %lu bytes: %s\n",
            argv0, (long unsigned int)size, strerror(errno));
        return 0;
    }
    else {
        fflush(stream);
        return 1;
    }
}